

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O0

Blob * __thiscall
jbcoin::STObject::getFieldVL(Blob *__return_storage_ptr__,STObject *this,SField *field)

{
  uint8_t *__first;
  uint8_t *puVar1;
  size_t sVar2;
  allocator<unsigned_char> local_55 [13];
  STBlob *local_48;
  STBlob *b;
  STBlob empty;
  SField *field_local;
  STObject *this_local;
  
  empty.value_.size_ = (size_t)field;
  STBlob::STBlob((STBlob *)&b);
  local_48 = getFieldByConstRef<jbcoin::STBlob,jbcoin::STBlob>
                       (this,(SField *)empty.value_.size_,(STBlob *)&b);
  __first = STBlob::data(local_48);
  puVar1 = STBlob::data(local_48);
  sVar2 = STBlob::size(local_48);
  std::allocator<unsigned_char>::allocator(local_55);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char_const*,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,__first,
             puVar1 + sVar2,local_55);
  std::allocator<unsigned_char>::~allocator(local_55);
  STBlob::~STBlob((STBlob *)&b);
  return __return_storage_ptr__;
}

Assistant:

Blob STObject::getFieldVL (SField const& field) const
{
    STBlob empty;
    STBlob const& b = getFieldByConstRef <STBlob> (field, empty);
    return Blob (b.data (), b.data () + b.size ());
}